

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkdecoder.c
# Opt level: O1

uint8_t * XPKDecoder_Decode(XPKDecoder *d,XPKEntry *entry,LPStatus *status)

{
  ushort uVar1;
  size_t sVar2;
  LPStatus LVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uchar byte;
  byte local_49;
  uint16_t *local_48;
  size_t *local_40;
  LPStatus *local_38;
  
  local_49 = 0;
  local_38 = status;
  fseek((FILE *)entry->xpk->file,(ulong)entry->offset,0);
  d->n_reps = 0;
  d->direct_counter = 0;
  local_48 = &d->next_holder;
  d->next_holder = 0;
  local_40 = &d->cur_x;
  d->cur_x = 0;
  d->cur_y = 0;
  d->repeat_markers[0] = (RepeatMarker *)0x0;
  d->repeat_markers[1] = (RepeatMarker *)0x0;
  d->repeat_markers[2] = (RepeatMarker *)0x0;
  d->repeat_markers[3] = (RepeatMarker *)0x0;
  d->repeat_marker_top = -1;
  puVar4 = (uint8_t *)calloc((ulong)entry->height * (ulong)entry->width,4);
  while ((local_49 != 0x41 || (d->n_reps == 0))) {
    sVar5 = ReadUint8(entry->xpk->file,1,&local_49);
    if (sVar5 == 0) {
      puVar4 = (uint8_t *)0x0;
      LPWarn("xpk","couldn\'t ReadUint8");
      LVar3 = LUNAPURPURA_ERROR;
      goto LAB_001061a6;
    }
    if ((ulong)entry->height <= d->cur_y) {
      d->cur_y = (ulong)entry->height - 1;
    }
    if (d->direct_counter == 0) {
      if (d->n_reps == 0) {
        puVar4 = (uint8_t *)
                 (*(code *)(&DAT_00108200 + *(int *)(&DAT_00108200 + (ulong)(local_49 >> 4) * 4)))()
        ;
        return puVar4;
      }
      sVar5 = d->cur_x;
      sVar2 = d->cur_y;
      uVar1 = entry->width;
      puVar6 = CLU_ColorAtIndex(entry->xpk->clu,(uint)local_49);
      uVar7 = d->n_reps;
      if (uVar7 != 0) {
        uVar9 = ((int)sVar5 + (int)sVar2 * (uint)uVar1) * 4;
        do {
          uVar7 = uVar7 - 1;
          puVar4[uVar9] = *puVar6;
          puVar4[uVar9 + 1] = puVar6[1];
          puVar4[uVar9 + 2] = puVar6[2];
          puVar4[uVar9 + 3] = 0xff;
          d->cur_x = d->cur_x + 1;
          uVar9 = uVar9 + 4;
          d->n_reps = uVar7;
        } while (uVar7 != 0);
      }
    }
    else {
      uVar8 = (ulong)(((uint)entry->width * (int)d->cur_y + (int)d->cur_x) * 4);
      puVar6 = CLU_ColorAtIndex(entry->xpk->clu,(uint)local_49);
      puVar4[uVar8] = *puVar6;
      puVar4[uVar8 + 1] = puVar6[1];
      puVar4[uVar8 + 2] = puVar6[2];
      puVar4[uVar8 + 3] = 0xff;
      d->cur_x = d->cur_x + 1;
      d->direct_counter = d->direct_counter - 1;
    }
  }
  LVar3 = LUNAPURPURA_OK;
LAB_001061a6:
  *local_38 = LVar3;
  return puVar4;
}

Assistant:

uint8_t *
XPKDecoder_Decode(XPKDecoder *d, XPKEntry *entry, LPStatus *status)
{
	unsigned char byte = 0;
	unsigned char instruction = 0;
	unsigned char argument = 0;
	const uint8_t *color = NULL;
	unsigned int rgba_i = 0;
	size_t rv = 0;

	fseek(entry->xpk->file, entry->offset, SEEK_SET);

	xpk_decoder_init(d);

	/* Totally transparent RGBA matrix */
	uint8_t *rgba = calloc(entry->width * entry->height, 4 * sizeof(uint8_t));

	while (!(byte == XPKINST_EOF && d->n_reps)) {
		rv = ReadUint8(entry->xpk->file, 1, &byte);

		if (!rv) {
			LPWarn(LP_SUBSYSTEM_XPK, "couldn't ReadUint8");
			*status = LUNAPURPURA_ERROR;
			return NULL;
		}

#ifdef LUNAPURPURA_XPK_HACK
			/* XXX HACK!! */
			if (d->cur_y >= entry->height) {
				d->cur_y = entry->height - 1;
			}
#endif

		if (d->direct_counter > 0) {
			/* DIRECT MODE ENABLED */
			rgba_i = (d->cur_y * entry->width * 4) + (d->cur_x * 4);
			color = CLU_ColorAtIndex(entry->xpk->clu, byte);
#ifdef LUNAPURPURA_XPK_TRACE
			LPWarn(LP_SUBSYSTEM_XPK, "(writing color %d)", byte);
#endif
			SET_COLOR(rgba, rgba_i, color[0], color[1], color[2]);
			d->cur_x++;
			d->direct_counter--;
		} else {
			/* DIRECT MODE OFF OR EXPIRED */
			if (d->n_reps > 0) {
				/* RLE ENGAGED */
				rgba_i = (d->cur_y * entry->width * 4) + (d->cur_x * 4);
				color = CLU_ColorAtIndex(entry->xpk->clu, byte);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "(writing %d reps of color %d)", d->n_reps, byte);
#endif
				for (; d->n_reps > 0; d->n_reps--) {
					SET_COLOR(rgba, rgba_i, color[0], color[1], color[2]);
					d->cur_x++;
				}
			} else {
				/* NEED A NEW INSTRUCTION */
				instruction = byte >> 4; /* First 4 bits */
				argument = byte & 0x0F; /* Last 4 bits */

				switch (instruction) {
				case XPKINST_REPEAT:
					{
						switch (byte) {
						case XPKINST_RLENEXT:
							ReadUint8(entry->xpk->file, 1 , &byte);
							d->n_reps = byte;
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "RLENEXT %d", byte);
#endif
							break;
						case XPKINST_REPEAT_END:
							{
								struct RepeatMarker *marker = current_repeat_marker(d);
								if (marker->reps > 0) {
											 marker->reps--;
								}
								if (marker->reps > 0) {
									fseek(entry->xpk->file, marker->loc, SEEK_SET);
#ifdef LUNAPURPURA_XPK_TRACE
									LPWarn(LP_SUBSYSTEM_XPK, "REPEAT_END (%d remaining)", marker->reps);
#endif
								} else {
									pop_repeat_marker(d);
								}
							}
							break;
						default:
							push_repeat_marker(d, false, argument, ftell(entry->xpk->file));
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "REPEAT %d", argument);
#endif
						}
					}
					break;
				case XPKINST_BIGREPEAT:
					push_repeat_marker(d, false, 16+argument, ftell(entry->xpk->file));
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGREPEAT %d", 16+argument);
#endif
					break;
				case XPKINST_XSKIP:
					if (argument) {
						d->cur_x += argument;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "XSKIP %d", argument);
#endif
					} else {
						ReadUint16(entry->xpk->file, 1, &d->next_holder);
						d->cur_x += d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "XSKIP %d", d->next_holder);
#endif
					}
					break;
				case XPKINST_BIGXSKIP:
					d->cur_x += (16 + argument);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGXSKIP %d", 16+argument);
#endif
					break;
				case XPKINST_RLE:
					/* 0x40 should be safe to ignore */
					d->n_reps = argument;
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "RLE %d", argument);
#endif
					break;
				case XPKINST_BIGRLE:
					d->n_reps = (16 + argument);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGRLE %d", 16+argument);
#endif
					break;
				case XPKINST_DIRECT:
					{
						if (argument) {
							d->direct_counter = argument;
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "DIRECT %d", argument);
#endif
						} else {
							ReadUint16(entry->xpk->file, 1, &d->next_holder);
							d->direct_counter = d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "DIRECT %d", d->next_holder);
#endif
						}
					}
					break;
				case XPKINST_BIGDIRECT:
					d->direct_counter = (16 + argument);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGDIRECT %d", 16+argument);
#endif
					break;
				case XPKINST_LINEREPEAT:
					{
						switch (byte) {
						case XPKINST_LINEREPEAT_END:
							{
								struct RepeatMarker *marker = current_repeat_marker(d);
								if (marker->reps > 0) {
									marker->reps--;
								}
								if (marker->reps > 0) {
									fseek(entry->xpk->file, marker->loc, SEEK_SET);
								} else {
									pop_repeat_marker(d);
								}
								NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
								LPWarn(LP_SUBSYSTEM_XPK, "LINEREPEAT_END (%d remaining)", marker->reps);
#endif
								break;
							}
						default:
							push_repeat_marker(d, true, argument, ftell(entry->xpk->file));
							NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "LINEREPEAT %d", argument);
#endif
						}
					}
					break;
				case XPKINST_BIGLINEREPEAT:
					{
						switch (byte) {
						case XPKINST_LINEREPEAT_END:
							{
								struct RepeatMarker *marker = current_repeat_marker(d);
								if (marker->reps > 0) {
									marker->reps--;
								}
								if (marker->reps > 0) {
									fseek(entry->xpk->file, marker->loc, SEEK_SET);
								} else {
									pop_repeat_marker(d);
								}
								NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
								LPWarn(LP_SUBSYSTEM_XPK, "BIGLINEREPEAT_END (%d remaining)", marker->reps);
#endif
								break;
							}
						default:
							push_repeat_marker(d, true, 16+argument, ftell(entry->xpk->file));
							NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "BIGLINEREPEAT %d", 16+argument);
#endif
						}
					}
					break;
				case XPKINST_SETXNL:
					if (argument) {
						d->cur_x = argument;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "SETXNL %d", argument);
#endif
					} else {
						ReadUint16(entry->xpk->file, 1, &d->next_holder);
						d->cur_x = d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "SETXNL %d", d->next_holder);
#endif
					}
					d->cur_y++;
					break;
				case XPKINST_BIGSETXNL:
					d->cur_x = (16 + argument);
					d->cur_y++;
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGSETXNL %d", 16+argument);
#endif
					break;
				case XPKINST_RLENL:
					d->n_reps = argument;
					NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "RLENL %d", argument);
#endif
					break;
				case XPKINST_BIGRLENL:
					d->n_reps = (16 + argument);
					NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGRLENL %d", 16+argument);
#endif
					break;
				case XPKINST_DIRECTNL:
					if (argument) {
						d->direct_counter = argument;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "DIRECTNL %d", argument);
#endif
					} else {
						ReadUint16(entry->xpk->file, 1, &d->next_holder);
						d->direct_counter = d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "DIRECTNL %d", d->next_holder);
#endif
					}
					NEWLINE(d);
					break;
				case XPKINST_BIGDIRECTNL:
					d->direct_counter = (16 + argument);
					NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGDIRECTNL %d", 16+argument);
#endif
					break;
				default:
					LPWarn(LP_SUBSYSTEM_XPK, "?? unhandled XPK instruction: 0x%X, ftell=%ld", byte, ftell(entry->xpk->file));
				}
			}
		}
	}

	*status = LUNAPURPURA_OK;
	return rgba;
}